

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O2

void __thiscall MockParser::MockParser(MockParser *this,char *code)

{
  int pkg;
  uint64_t name;
  Err *pointer;
  Message *pMVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138 [34];
  AssertHelper local_28;
  
  vm_new();
  memcpy(this,local_138,0x110);
  this->cur_fn = 0;
  this->cur_ins = 0;
  name = hash_string("test",4);
  pkg = vm_new_pkg(&this->vm,name);
  pointer = parse(&this->vm,pkg,(char *)0x0,code);
  if (pointer != (Err *)0x0) {
    testing::Message::Message((Message *)local_138);
    pMVar1 = testing::Message::operator<<((Message *)local_138,&pointer->desc);
    pMVar1 = testing::Message::operator<<(pMVar1,(char (*) [10])" at line ");
    pMVar1 = testing::Message::operator<<(pMVar1,&pointer->line);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0x23,"Failed");
    testing::internal::AssertHelper::operator=(&local_28,pMVar1);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(local_138);
  }
  return;
}

Assistant:

MockParser(const char *code) {
		vm = vm_new();
		cur_fn = 0;
		cur_ins = 0;

		// Add a package (its main function is created automatically)
		int pkg = vm_new_pkg(&vm, hash_string("test", 4));

		// Parse the source code
		Err *err = parse(&vm, pkg, NULL, (char *) code);
		if (err != NULL) {
			ADD_FAILURE() << err->desc << " at line " << err->line;
		}
	}